

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_utils.h
# Opt level: O2

void transpose(uint8_t *src,ptrdiff_t pitchSrc,uint8_t *dst,ptrdiff_t pitchDst,int width,int height)

{
  undefined8 uVar1;
  uint8_t *puVar2;
  long lVar3;
  long lVar4;
  uint8_t *puVar5;
  int i;
  long lVar6;
  uint8_t *puVar7;
  __m128i d [16];
  __m128i r [16];
  longlong local_238 [65];
  
  for (lVar3 = 0; lVar3 < height; lVar3 = lVar3 + 0x10) {
    puVar5 = src;
    puVar7 = dst;
    for (lVar6 = 0; lVar6 < width; lVar6 = lVar6 + 0x10) {
      puVar2 = puVar5;
      for (lVar4 = 0; lVar4 != 0x100; lVar4 = lVar4 + 0x10) {
        uVar1 = *(undefined8 *)(puVar2 + 8);
        *(undefined8 *)((long)local_238 + lVar4 + 0x100) = *(undefined8 *)puVar2;
        *(undefined8 *)((long)local_238 + lVar4 + 0x108) = uVar1;
        puVar2 = puVar2 + pitchSrc;
      }
      transpose16x16_sse2((__m128i *)(local_238 + 0x20),(__m128i *)local_238);
      puVar2 = puVar7;
      for (lVar4 = 0; lVar4 != 0x100; lVar4 = lVar4 + 0x10) {
        uVar1 = *(undefined8 *)((long)local_238 + lVar4 + 8);
        *(undefined8 *)puVar2 = *(undefined8 *)((long)local_238 + lVar4);
        *(undefined8 *)(puVar2 + 8) = uVar1;
        puVar2 = puVar2 + pitchDst;
      }
      puVar5 = puVar5 + pitchSrc * 0x10;
      puVar7 = puVar7 + 0x10;
    }
    src = src + 0x10;
    dst = dst + pitchDst * 0x10;
  }
  return;
}

Assistant:

static void transpose(const uint8_t *src, ptrdiff_t pitchSrc, uint8_t *dst,
                      ptrdiff_t pitchDst, int width, int height) {
  for (int j = 0; j < height; j += 16)
    for (int i = 0; i < width; i += 16)
      transpose_TX_16X16(src + i * pitchSrc + j, pitchSrc,
                         dst + j * pitchDst + i, pitchDst);
}